

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Performance::getShaderInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,Functions *gl,deUint32 shader)

{
  char *pcVar1;
  pointer pcVar2;
  undefined4 in_register_0000000c;
  int infoLogLen;
  vector<char,_std::allocator<char>_> infoLogBuf;
  int local_4c;
  vector<char,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_4c = 0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (**(code **)(this + 0xa70))
            ((ulong)gl & 0xffffffff,0x8b84,&local_4c,CONCAT44(in_register_0000000c,shader));
  std::vector<char,_std::allocator<char>_>::resize(&local_48,(long)(local_4c + 1));
  (**(code **)(this + 0xa58))
            ((ulong)gl & 0xffffffff,local_4c + 1,0,
             local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  pcVar2 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
  strlen(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start);
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar2);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static string getShaderInfoLog (const glw::Functions& gl, deUint32 shader)
{
	string			result;
	int				infoLogLen = 0;
	vector<char>	infoLogBuf;

	gl.getShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLen);
	infoLogBuf.resize(infoLogLen + 1);
	gl.getShaderInfoLog(shader, infoLogLen + 1, DE_NULL, &infoLogBuf[0]);
	result = &infoLogBuf[0];

	return result;
}